

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O3

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::MakeTrackerCalls
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,Descriptor *message,Options *opts)

{
  Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> calls;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  *pvVar1;
  uint uVar2;
  char *args_1;
  long lVar3;
  basic_string_view<char,_std::char_traits<char>_> *args;
  bool bVar4;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  string_view format_14;
  string_view format_15;
  string_view format_16;
  string_view format_17;
  string_view format_18;
  string_view format_19;
  string_view format_20;
  string_view format_21;
  string_view format_22;
  string_view format_23;
  string_view format_24;
  string_view format_25;
  _Storage<int,_true> local_b38;
  undefined4 uStack_b34;
  undefined7 uStack_b1f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b18;
  bool local_b00;
  Call local_af8;
  Options *local_a98;
  Options *local_a90;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  *local_a88;
  DescriptorNames *local_a80 [2];
  DescriptorNames local_a70 [2];
  char local_a60;
  undefined1 local_a58 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a18;
  bool local_a00;
  undefined8 local_9f8;
  char *local_9f0;
  undefined8 local_9e8;
  char *local_9e0;
  undefined1 local_9d4;
  undefined8 local_9d0;
  char *local_9c8;
  undefined1 uStack_9c0;
  undefined7 uStack_9bf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9b8;
  undefined1 local_9a0;
  undefined8 local_998;
  char *pcStack_990;
  undefined8 local_988;
  char *pcStack_980;
  undefined1 local_974;
  undefined8 local_970;
  char *local_968;
  undefined1 local_960;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_958;
  undefined1 local_940;
  undefined8 local_938;
  char *pcStack_930;
  undefined8 local_928;
  char *pcStack_920;
  undefined1 local_914;
  undefined8 local_910;
  char *local_908;
  undefined1 local_900;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8f8;
  undefined1 local_8e0;
  undefined8 local_8d8;
  char *pcStack_8d0;
  undefined8 local_8c8;
  char *pcStack_8c0;
  undefined1 local_8b4;
  undefined8 local_8b0;
  char *local_8a8;
  undefined1 local_8a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_898;
  undefined1 local_880;
  undefined8 local_878;
  char *local_870;
  undefined8 local_868;
  char *local_860;
  undefined4 local_858;
  uint uStack_854;
  undefined8 local_850;
  char *local_848;
  undefined1 uStack_840;
  undefined7 uStack_83f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_838;
  undefined1 local_820;
  undefined1 local_818 [32];
  ulong local_7f8;
  undefined8 local_7f0;
  char *local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined1 local_7c0;
  undefined8 local_7b8;
  char *pcStack_7b0;
  undefined8 local_7a8;
  char *pcStack_7a0;
  undefined1 local_794;
  undefined8 local_790;
  char *local_788;
  undefined1 local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined1 local_760;
  undefined8 local_758;
  char *pcStack_750;
  undefined8 local_748;
  char *pcStack_740;
  undefined1 local_734;
  undefined8 local_730;
  char *local_728;
  undefined1 local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined1 local_700;
  undefined8 local_6f8;
  char *pcStack_6f0;
  undefined8 local_6e8;
  char *pcStack_6e0;
  undefined1 local_6d4;
  undefined8 local_6d0;
  char *local_6c8;
  undefined1 local_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined1 local_6a0;
  Call local_698;
  undefined8 local_638;
  char *local_630;
  undefined8 local_628;
  char *local_620;
  undefined1 local_614;
  undefined8 local_610;
  char *local_608;
  undefined1 local_600;
  undefined8 local_5f8;
  undefined1 uStack_5f0;
  undefined7 uStack_5ef;
  undefined1 uStack_5e8;
  undefined8 uStack_5e7;
  undefined8 local_5d8;
  char *local_5d0;
  undefined8 local_5c8;
  char *local_5c0;
  undefined1 local_5b4;
  undefined8 local_5b0;
  char *local_5a8;
  undefined1 local_5a0;
  undefined8 uStack_598;
  undefined1 uStack_590;
  undefined7 local_58f;
  undefined1 uStack_588;
  undefined8 uStack_587;
  Call local_578;
  Call local_518;
  Call local_4b8;
  Call local_458;
  Call local_3f8;
  Call local_398;
  Call local_338;
  Call local_2d8;
  Call local_278;
  Call local_218;
  Call local_1b8;
  Call local_158;
  Call local_f8;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  char *pcStack_80;
  ulong local_78;
  undefined8 uStack_70;
  char *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined1 local_40;
  
  uVar2 = uStack_854;
  bVar4 = (message->options_->field_0)._impl_.map_entry_ != false;
  args_1 = "_impl_._extensions_";
  if (bVar4) {
    args_1 = "_extensions_";
  }
  args = (basic_string_view<char,_std::char_traits<char>_> *)&DAT_00000013;
  if (bVar4) {
    args = (basic_string_view<char,_std::char_traits<char>_> *)0xc;
  }
  local_878 = 9;
  local_870 = "serialize";
  local_868 = 0xb;
  local_860 = "OnSerialize";
  uStack_854 = uStack_854 & 0xffffff00;
  local_820 = 0;
  local_850 = 6;
  local_848 = "&this_";
  uStack_840 = 1;
  local_818._0_8_ = (pointer)0x9;
  local_818._8_8_ = (long)"Msg::serialize" + 5;
  local_818._16_8_ = 0xb;
  local_818._24_8_ = "OnSerialize";
  local_7f8 = CONCAT44(uVar2,local_858) & 0xffffff00ffffffff;
  local_7f0 = 6;
  local_8d8 = 0xb;
  pcStack_8d0 = "deserialize";
  local_8c8 = 0xd;
  pcStack_8c0 = "OnDeserialize";
  uStack_7e0 = CONCAT71(uStack_83f,1);
  local_7e8 = "&this_";
  local_7d8 = 0;
  uStack_7d0 = 0;
  local_7c8 = 0;
  local_7c0 = 0;
  local_8b4 = 0;
  local_880 = 0;
  local_8b0 = 5;
  local_8a8 = "_this";
  local_8a0 = 1;
  local_788 = "_this";
  local_790 = 5;
  local_938 = 10;
  pcStack_930 = "reflection";
  local_928 = 0xd;
  pcStack_920 = "OnGetMetadata";
  local_780 = 1;
  local_794 = 0;
  local_7a8 = 0xd;
  pcStack_7a0 = "OnDeserialize";
  local_7b8 = 0xb;
  pcStack_7b0 = "deserialize";
  local_768 = 0;
  local_778 = 0;
  uStack_770 = 0;
  local_760 = 0;
  local_914 = 0;
  local_910 = 4;
  local_908 = "this";
  local_8e0 = 0;
  local_900 = 0;
  local_728 = "this";
  local_730 = 4;
  local_998 = 8;
  pcStack_990 = "bytesize";
  local_988 = 10;
  pcStack_980 = "OnByteSize";
  local_974 = 0;
  local_940 = 0;
  local_970 = 6;
  local_968 = "&this_";
  local_720 = 0;
  local_734 = 0;
  local_748 = 0xd;
  pcStack_740 = "OnGetMetadata";
  local_758 = 10;
  pcStack_750 = "reflection";
  local_708 = 0;
  local_718 = 0;
  uStack_710 = 0;
  local_700 = 0;
  local_960 = 1;
  local_6c8 = "&this_";
  local_6d0 = 6;
  local_9f8._0_4_ = 9;
  local_9f8._4_4_ = 0;
  local_9f0 = "mergefrom";
  local_9e8._0_4_ = 0xb;
  local_9e8._4_4_ = 0;
  local_9e0 = "OnMergeFrom";
  local_9d4 = 0;
  local_9a0 = 0;
  local_9d0 = 5;
  local_9c8 = "_this";
  uStack_9c0 = 1;
  local_a58._0_8_ = (MessageOptions *)0x9;
  local_a58._8_8_ = "mergefrom";
  local_a58._16_8_ = (FeatureSet *)0xb;
  local_a58._24_8_ = "OnMergeFrom";
  local_a58._40_8_ = 5;
  local_6c0 = 1;
  local_6d4 = 0;
  local_a58[0x24] = false;
  local_a60 = '\0';
  local_838.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_898.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8 = 10;
  pcStack_6e0 = "OnByteSize";
  local_6f8 = 8;
  pcStack_6f0 = "bytesize";
  local_6a8 = 0;
  local_6b8 = 0;
  uStack_6b0 = 0;
  local_958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6a0 = 0;
  local_a58._56_8_ = CONCAT71(uStack_9bf,true);
  local_a58._48_8_ = "_this";
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a00 = false;
  local_838.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_838.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_898.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_898.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  format._M_str = "&from";
  format._M_len = 5;
  local_a98 = opts;
  local_a90 = (Options *)message;
  local_a88 = __return_storage_ptr__;
  anon_unknown_0::Call::Arg<>(&local_698,(Call *)local_a58,format);
  local_638 = 0xe;
  local_630 = "unknown_fields";
  local_628 = 0xf;
  local_620 = "OnUnknownFields";
  local_614 = 0;
  local_610 = 4;
  local_608 = "this";
  local_600 = 1;
  local_5f8 = 0;
  uStack_5f0 = 0;
  uStack_5ef = 0;
  uStack_5e8 = 0;
  uStack_5e7 = 0;
  local_5d8 = 0x16;
  local_5d0 = "mutable_unknown_fields";
  local_5c8 = 0x16;
  local_5c0 = "OnMutableUnknownFields";
  local_5b4 = 0;
  local_5b0 = 4;
  local_5a8 = "this";
  local_5a0 = 1;
  uStack_588 = 0;
  uStack_587 = 0;
  uStack_598 = 0;
  uStack_590 = 0;
  local_58f = 0;
  local_af8.var._M_len = 0xd;
  local_af8.var._M_str = "extension_has";
  local_af8.call._M_len = 0xe;
  local_af8.call._M_str = "OnHasExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_00._M_str = "id.number()";
  format_00._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_00);
  format_01._M_str = "$0::GetPtr(id.number(), $1, id.default_value_ref())";
  format_01._M_len = 0x33;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_578,&stack0xfffffffffffff4a8,format_01,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0xd;
  local_af8.var._M_str = "extension_get";
  local_af8.call._M_len = 0xe;
  local_af8.call._M_str = "OnGetExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_02._M_str = "id.number()";
  format_02._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_02);
  format_03._M_str = "$0::GetPtr(id.number(), $1, id.default_value_ref())";
  format_03._M_len = 0x33;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_518,&stack0xfffffffffffff4a8,format_03,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0x11;
  local_af8.var._M_str = "extension_mutable";
  local_af8.call._M_len = 0x12;
  local_af8.call._M_str = "OnMutableExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_04._M_str = "id.number()";
  format_04._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_04);
  format_05._M_str = "$0::GetPtr(id.number(), $1, id.default_value_ref())";
  format_05._M_len = 0x33;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_4b8,&stack0xfffffffffffff4a8,format_05,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0xd;
  local_af8.var._M_str = "extension_set";
  local_af8.call._M_len = 0xe;
  local_af8.call._M_str = "OnSetExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_06._M_str = "id.number()";
  format_06._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_06);
  format_07._M_str = "$0::GetPtr(id.number(), $1, id.default_value_ref())";
  format_07._M_len = 0x33;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_458,&stack0xfffffffffffff4a8,format_07,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0x11;
  local_af8.var._M_str = "extension_release";
  local_af8.call._M_len = 0x12;
  local_af8.call._M_str = "OnReleaseExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_08._M_str = "id.number()";
  format_08._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_08);
  format_09._M_str = "$0::GetPtr(id.number(), $1, id.default_value_ref())";
  format_09._M_len = 0x33;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_3f8,&stack0xfffffffffffff4a8,format_09,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0x16;
  local_af8.var._M_str = "repeated_extension_get";
  local_af8.call._M_len = 0xe;
  local_af8.call._M_str = "OnGetExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_10._M_str = "id.number()";
  format_10._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_10);
  format_11._M_str = "$0::GetPtr(id.number(), $1, index)";
  format_11._M_len = 0x22;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_398,&stack0xfffffffffffff4a8,format_11,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0x1a;
  local_af8.var._M_str = "repeated_extension_mutable";
  local_af8.call._M_len = 0x12;
  local_af8.call._M_str = "OnMutableExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_12._M_str = "id.number()";
  format_12._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_12);
  format_13._M_str = "$0::GetPtr(id.number(), $1, index)";
  format_13._M_len = 0x22;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_338,&stack0xfffffffffffff4a8,format_13,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0x16;
  local_af8.var._M_str = "repeated_extension_set";
  local_af8.call._M_len = 0xe;
  local_af8.call._M_str = "OnSetExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_14._M_str = "id.number()";
  format_14._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_14);
  format_15._M_str = "$0::GetPtr(id.number(), $1, index)";
  format_15._M_len = 0x22;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_2d8,&stack0xfffffffffffff4a8,format_15,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0x16;
  local_af8.var._M_str = "repeated_extension_add";
  local_af8.call._M_len = 0xe;
  local_af8.call._M_str = "OnAddExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_16._M_str = "id.number()";
  format_16._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_16);
  format_17._M_str = "$0::GetPtr(id.number(), $1, $1.ExtensionSize(id.number()) - 1)";
  format_17._M_len = 0x3e;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_278,&stack0xfffffffffffff4a8,format_17,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0x1e;
  local_af8.var._M_str = "repeated_extension_add_mutable";
  local_af8.call._M_len = 0x15;
  local_af8.call._M_str = "OnAddMutableExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_18._M_str = "id.number()";
  format_18._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_18);
  format_19._M_str = "$0::GetPtr(id.number(), $1, $1.ExtensionSize(id.number()) - 1)";
  format_19._M_len = 0x3e;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_218,&stack0xfffffffffffff4a8,format_19,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0x17;
  local_af8.var._M_str = "extension_repeated_size";
  local_af8.call._M_len = 0xf;
  local_af8.call._M_str = "OnExtensionSize";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_20._M_str = "id.number()";
  format_20._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_20);
  format_21._M_str = "$0::GetRepeatedPtr(id.number(), $1)";
  format_21._M_len = 0x23;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_1b8,&stack0xfffffffffffff4a8,format_21,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0x17;
  local_af8.var._M_str = "repeated_extension_list";
  local_af8.call._M_len = 0xf;
  local_af8.call._M_str = "OnListExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_22._M_str = "id.number()";
  format_22._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_22);
  format_23._M_str = "$0::GetRepeatedPtr(id.number(), $1)";
  format_23._M_len = 0x23;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_158,&stack0xfffffffffffff4a8,format_23,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  local_af8.var._M_len = 0x1f;
  local_af8.var._M_str = "repeated_extension_list_mutable";
  local_af8.call._M_len = 0x16;
  local_af8.call._M_str = "OnMutableListExtension";
  local_af8.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_af8.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_af8.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_af8._81_8_ = 0;
  format_24._M_str = "id.number()";
  format_24._M_len = 0xb;
  anon_unknown_0::Call::Arg<>((Call *)&stack0xfffffffffffff4a8,&local_af8,format_24);
  format_25._M_str = "$0::GetRepeatedPtr(id.number(), $1)";
  format_25._M_len = 0x23;
  (anonymous_namespace)::Call::
  Arg<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_f8,&stack0xfffffffffffff4a8,format_25,args,
             (basic_string_view<char,_std::char_traits<char>_> *)args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af8.args);
  pvVar1 = local_a88;
  local_b00 = true;
  local_98 = 0xf;
  pcStack_90 = "extension_clear";
  local_88 = 0x10;
  pcStack_80 = "OnClearExtension";
  local_78 = CONCAT44(uStack_b34,local_b38._M_value) & 0xffffff00ffffffff;
  uStack_70 = 4;
  uStack_60 = CONCAT71(uStack_b1f,1);
  local_68 = "this";
  local_48 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_b18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = 1;
  calls.len_ = (size_type)"extension_clear";
  calls.ptr_ = (pointer)0xf;
  anon_unknown_0::GenerateTrackerCalls
            (local_a88,(anon_unknown_0 *)local_a98,local_a90,(Descriptor *)local_a80,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_818,calls);
  lVar3 = 0x7c0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_818 + lVar3));
    lVar3 = lVar3 + -0x60;
  } while (lVar3 != -0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_958);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_898);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_838);
  if (local_a60 == '\x01') {
    local_a60 = 0;
    if (local_a80[0] != local_a70) {
      operator_delete(local_a80[0],(ulong)(local_a70[0].payload_ + 1));
    }
  }
  return pvVar1;
}

Assistant:

std::vector<Sub> MakeTrackerCalls(const Descriptor* message,
                                  const Options& opts) {
  absl::string_view extns =
      IsMapEntryMessage(message) ? "_extensions_" : "_impl_._extensions_";

  auto primitive_extn_accessor = [extns](absl::string_view var,
                                         absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetPtr(id.number(), $1, id.default_value_ref())", kTypeTraits,
             extns);
  };

  auto index_extn_accessor = [extns](absl::string_view var,
                                     absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetPtr(id.number(), $1, index)", kTypeTraits, extns);
  };

  auto add_extn_accessor = [extns](absl::string_view var,
                                   absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetPtr(id.number(), $1, $1.ExtensionSize(id.number()) - 1)",
             kTypeTraits, extns);
  };

  auto list_extn_accessor = [extns](absl::string_view var,
                                    absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetRepeatedPtr(id.number(), $1)", kTypeTraits, extns);
  };

  return GenerateTrackerCalls(
      opts, message, absl::nullopt,
      {
          Call("serialize", "OnSerialize").This("&this_"),
          Call("deserialize", "OnDeserialize").This("_this"),
          // TODO: Ideally annotate_reflection should not exist and we
          // need to annotate all reflective calls on our own, however, as this
          // is a cause for side effects, i.e. reading values dynamically, we
          // want the users know that dynamic access can happen.
          Call("reflection", "OnGetMetadata").This(absl::nullopt),
          Call("bytesize", "OnByteSize").This("&this_"),
          Call("mergefrom", "OnMergeFrom").This("_this").Arg("&from"),
          Call("unknown_fields", "OnUnknownFields"),
          Call("mutable_unknown_fields", "OnMutableUnknownFields"),

          // "Has" is here as users calling "has" on a repeated field is a
          // mistake.
          primitive_extn_accessor("extension_has", "OnHasExtension"),
          primitive_extn_accessor("extension_get", "OnGetExtension"),
          primitive_extn_accessor("extension_mutable", "OnMutableExtension"),
          primitive_extn_accessor("extension_set", "OnSetExtension"),
          primitive_extn_accessor("extension_release", "OnReleaseExtension"),

          index_extn_accessor("repeated_extension_get", "OnGetExtension"),
          index_extn_accessor("repeated_extension_mutable",
                              "OnMutableExtension"),
          index_extn_accessor("repeated_extension_set", "OnSetExtension"),

          add_extn_accessor("repeated_extension_add", "OnAddExtension"),
          add_extn_accessor("repeated_extension_add_mutable",
                            "OnAddMutableExtension"),

          list_extn_accessor("extension_repeated_size", "OnExtensionSize"),
          list_extn_accessor("repeated_extension_list", "OnListExtension"),
          list_extn_accessor("repeated_extension_list_mutable",
                             "OnMutableListExtension"),

          // Generic accessors such as "clear".
          // TODO: Generalize clear from both repeated and non
          // repeated calls, currently their underlying memory interfaces are
          // very different. Or think of removing clear callback as no usages
          // are needed and no memory exist
          Call("extension_clear", "OnClearExtension").Suppressed(),
      });
}